

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintString
          (FastFieldValuePrinter *this,string *val,BaseTextGenerator *generator)

{
  string local_40;
  
  (*generator->_vptr_BaseTextGenerator[5])(generator,"\"",1);
  CEscape(&local_40,val);
  (*generator->_vptr_BaseTextGenerator[5])
            (generator,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_40);
  (*generator->_vptr_BaseTextGenerator[5])(generator,"\"",1);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintString(
    const std::string& val, BaseTextGenerator* generator) const {
  generator->PrintLiteral("\"");
  generator->PrintString(CEscape(val));
  generator->PrintLiteral("\"");
}